

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

Handle __thiscall
dg::vr::ValueRelations::newPlaceholderBucket<llvm::Value_const*>(ValueRelations *this,Value **from)

{
  bool bVar1;
  HandlePtr pBVar2;
  Bucket *pBVar3;
  RelationsGraph<dg::vr::ValueRelations> *in_RDI;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  *unaff_retaddr;
  Handle h;
  HandlePtr mH;
  undefined4 in_stack_ffffffffffffffb8;
  Type in_stack_ffffffffffffffbc;
  Bucket *in_stack_ffffffffffffffc0;
  V in_stack_ffffffffffffffd8;
  ValueRelations *in_stack_ffffffffffffffe0;
  RelationsGraph<dg::vr::ValueRelations> *this_00;
  key_type *in_stack_fffffffffffffff8;
  
  this_00 = in_RDI;
  pBVar2 = maybeGet(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if ((pBVar2 == (HandlePtr)0x0) ||
     (bVar1 = Bucket::hasRelation(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc), !bVar1)) {
    pBVar3 = RelationsGraph<dg::vr::ValueRelations>::getNewBucket(this_00);
    std::reference_wrapper<dg::vr::Bucket_const>::
    reference_wrapper<dg::vr::Bucket_const&,void,dg::vr::Bucket_const*>
              ((reference_wrapper<const_dg::vr::Bucket> *)
               &in_RDI[1].buckets._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Bucket *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    std::
    map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
    ::operator[](unaff_retaddr,in_stack_fffffffffffffff8);
  }
  else {
    pBVar3 = Bucket::getRelated(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return pBVar3;
}

Assistant:

Handle newPlaceholderBucket(const X &from) {
        HandlePtr mH = maybeGet(from);
        if (mH && mH->hasRelation(Relations::PT)) {
            return mH->getRelated(Relations::PT);
        }

        Handle h = graph.getNewBucket();
        bucketToVals[h];
        return h;
    }